

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall
llm_build_gptneox::llm_build_gptneox
          (llm_build_gptneox *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *this_00;
  pointer plVar2;
  ggml_context *pgVar3;
  uint32_t uVar4;
  ggml_tensor *pgVar5;
  llm_graph_input_attn_kv_unified *inp;
  ulong uVar6;
  ggml_tensor *pgVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ggml_tensor *pgVar11;
  ggml_tensor *cur;
  int il;
  int il_00;
  long lVar12;
  ggml_tensor *attn_out;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar13;
  ggml_tensor *local_78;
  long local_70;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  this_00 = (this->super_llm_graph_context).hparams;
  uVar1 = this_00->n_embd_head_v;
  uVar4 = llama_hparams::n_embd_v_gqa(this_00,0);
  if (uVar1 != ((this->super_llm_graph_context).hparams)->n_embd_head_k) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2576,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_78 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  pgVar5 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  uVar6 = (ulong)uVar4;
  local_70 = 0;
  for (lVar12 = 0; uVar13 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20),
      lVar12 < (this->super_llm_graph_context).n_layer; lVar12 = lVar12 + 1) {
    plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    il_00 = (int)lVar12;
    pgVar7 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,local_78,
                        *(ggml_tensor **)((long)&plVar2->attn_norm + local_70),
                        *(ggml_tensor **)((long)&plVar2->attn_norm_b + local_70),LLM_NORM,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"attn_norm",il_00);
    pgVar7 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->wqkv + local_70),pgVar7
                       );
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"wqkv",il_00);
    pgVar7 = (ggml_tensor *)
             ggml_add((this->super_llm_graph_context).ctx0,pgVar7,
                      *(undefined8 *)
                       ((long)&((model->layers).
                                super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                _M_impl.super__Vector_impl_data._M_start)->bqkv + local_70));
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"bqkv",il_00);
    pgVar3 = (this->super_llm_graph_context).ctx0;
    uVar8 = ggml_view_2d(pgVar3,pgVar7,(this->super_llm_graph_context).n_embd,
                         (long)(this->super_llm_graph_context).n_tokens,pgVar7->nb[1],0);
    uVar8 = ggml_cont(pgVar3,uVar8);
    pgVar3 = (this->super_llm_graph_context).ctx0;
    uVar9 = ggml_view_2d(pgVar3,pgVar7,uVar6,(long)(this->super_llm_graph_context).n_tokens,
                         pgVar7->nb[1],(this->super_llm_graph_context).n_embd << 2);
    uVar9 = ggml_cont(pgVar3,uVar9);
    pgVar3 = (this->super_llm_graph_context).ctx0;
    uVar10 = ggml_view_2d(pgVar3,pgVar7,uVar6,(long)(this->super_llm_graph_context).n_tokens,
                          pgVar7->nb[1],((this->super_llm_graph_context).n_embd + uVar6) * 4);
    uVar10 = ggml_cont(pgVar3,uVar10);
    uVar8 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar8,uVar1,
                            (this->super_llm_graph_context).n_head,
                            (long)(this->super_llm_graph_context).n_tokens);
    uVar9 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar9,uVar1,
                            (this->super_llm_graph_context).n_head_kv,
                            (long)(this->super_llm_graph_context).n_tokens);
    pgVar7 = (ggml_tensor *)
             ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar10,uVar1,
                             (this->super_llm_graph_context).n_head_kv,
                             (long)(this->super_llm_graph_context).n_tokens);
    pgVar11 = (ggml_tensor *)
              ggml_rope_ext((this->super_llm_graph_context).freq_base,
                            (this->super_llm_graph_context).freq_scale,
                            (this->super_llm_graph_context).ext_factor,
                            (this->super_llm_graph_context).attn_factor,
                            (this->super_llm_graph_context).beta_fast,
                            (this->super_llm_graph_context).beta_slow,
                            (this->super_llm_graph_context).ctx0,uVar8,pgVar5,0,
                            (int)(this->super_llm_graph_context).n_rot,
                            (this->super_llm_graph_context).rope_type,
                            CONCAT44(uVar13,(this->super_llm_graph_context).n_ctx_orig));
    cur = (ggml_tensor *)
          ggml_rope_ext((this->super_llm_graph_context).freq_base,
                        (this->super_llm_graph_context).freq_scale,
                        (this->super_llm_graph_context).ext_factor,
                        (this->super_llm_graph_context).attn_factor,
                        (this->super_llm_graph_context).beta_fast,
                        (this->super_llm_graph_context).beta_slow,
                        (this->super_llm_graph_context).ctx0,uVar9,pgVar5,0,
                        (int)(this->super_llm_graph_context).n_rot,
                        (this->super_llm_graph_context).rope_type,
                        (this->super_llm_graph_context).n_ctx_orig);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"Qcur",il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,cur,"Kcur",il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Vcur",il_00);
    plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    pgVar7 = llm_graph_context::build_attn
                       (&this->super_llm_graph_context,inp,gf,
                        *(ggml_tensor **)((long)&plVar2->wo + local_70),
                        *(ggml_tensor **)((long)&plVar2->bo + local_70),pgVar11,cur,pgVar7,
                        (ggml_tensor *)0x0,(ggml_tensor *)0x0,1.0 / SQRT((float)uVar1),il_00);
    if (lVar12 == (this->super_llm_graph_context).n_layer + -1) {
      pgVar11 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
      pgVar7 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar7,pgVar11);
      local_78 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,local_78,pgVar11)
      ;
    }
    if (((this->super_llm_graph_context).hparams)->use_par_res == true) {
      plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar11 = llm_graph_context::build_norm
                          (&this->super_llm_graph_context,local_78,
                           *(ggml_tensor **)((long)&plVar2->ffn_norm + local_70),
                           *(ggml_tensor **)((long)&plVar2->ffn_norm_b + local_70),LLM_NORM,il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_norm",il_00);
      plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      in_stack_ffffffffffffff38 = 0;
      pgVar11 = llm_graph_context::build_ffn
                          (&this->super_llm_graph_context,pgVar11,
                           *(ggml_tensor **)((long)&plVar2->ffn_up + local_70),
                           *(ggml_tensor **)((long)&plVar2->ffn_up_b + local_70),(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                           *(ggml_tensor **)((long)&plVar2->ffn_down + local_70),
                           *(ggml_tensor **)((long)&plVar2->ffn_down_b + local_70),
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_GELU,LLM_FFN_SEQ,il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_out",il_00);
      pgVar11 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar11,local_78);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_out",il_00);
      pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar11,pgVar7);
      local_78 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar7,il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,local_78,"l_out",il_00);
    }
    else {
      pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar7,local_78);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"ffn_inp",il_00);
      plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar11 = llm_graph_context::build_norm
                          (&this->super_llm_graph_context,pgVar7,
                           *(ggml_tensor **)((long)&plVar2->ffn_norm + local_70),
                           *(ggml_tensor **)((long)&plVar2->ffn_norm_b + local_70),LLM_NORM,il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_norm",il_00);
      plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      in_stack_ffffffffffffff38 = 0;
      pgVar11 = llm_graph_context::build_ffn
                          (&this->super_llm_graph_context,pgVar11,
                           *(ggml_tensor **)((long)&plVar2->ffn_up + local_70),
                           *(ggml_tensor **)((long)&plVar2->ffn_up_b + local_70),(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                           *(ggml_tensor **)((long)&plVar2->ffn_down + local_70),
                           *(ggml_tensor **)((long)&plVar2->ffn_down_b + local_70),
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_GELU,LLM_FFN_SEQ,il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_out",il_00);
      pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar11,pgVar7);
      local_78 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar7,il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,local_78,"l_out",il_00);
    }
    local_70 = local_70 + 0x4f0;
  }
  pgVar5 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,local_78,model->output_norm,
                      model->output_norm_b,LLM_NORM,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar5;
  pgVar5 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar5);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar5;
  ggml_build_forward_expand(gf,pgVar5);
  return;
}

Assistant:

llm_build_gptneox(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            cur = build_norm(inpL,
                    model.layers[il].attn_norm,
                    model.layers[il].attn_norm_b,
                    LLM_NORM, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                cb(cur, "bqkv", il);

                ggml_tensor * Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                ggml_tensor * Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                ggml_tensor * Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            // ffn
            if (hparams.use_par_res) {
                // attention and ffn are computed in parallel
                // x = x + attn(ln1(x)) + ffn(ln2(x))

                ggml_tensor * attn_out = cur;

                cur = build_norm(inpL,
                        model.layers[il].ffn_norm,
                        model.layers[il].ffn_norm_b,
                        LLM_NORM, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        NULL,                      NULL,                        NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);

                cur = ggml_add(ctx0, cur, inpL);
                cb(cur, "ffn_out", il);

                cur = ggml_add(ctx0, cur, attn_out);

                cur = build_cvec(cur, il);
                cb(cur, "l_out", il);

                // input for next layer
                inpL = cur;
            } else {
                // attention and ffn are computed sequentially
                // x = x + attn(ln1(x))
                // x = x + ffn(ln2(x))

                ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
                cb(ffn_inp, "ffn_inp", il);

                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm,
                        model.layers[il].ffn_norm_b,
                        LLM_NORM, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        NULL,                      NULL,                        NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);

                cur = ggml_add(ctx0, cur, ffn_inp);

                cur = build_cvec(cur, il);
                cb(cur, "l_out", il);

                // input for next layer
                inpL = cur;
            }
        }

        cur = build_norm(inpL,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }